

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Parser::_rval_dash_start_or_continue_seq(Parser *this)

{
  pfn_error p_Var1;
  Location LVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  error_flags eVar6;
  Parser *in_RDI;
  size_t delta_ind;
  size_t in_stack_00000058;
  Parser *in_stack_00000060;
  char msg [39];
  size_t ind;
  undefined1 in_stack_000002d7;
  Parser *in_stack_000002d8;
  flag_t in_stack_ffffffffffffff18;
  flag_t in_stack_ffffffffffffff1c;
  Parser *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined8 local_90;
  Parser *pPStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  size_t local_70;
  char local_68 [55];
  Parser *this_00;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  char *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  register0x00000000 = LineContents::current_col((LineContents *)in_stack_ffffffffffffff20);
  if (register0x00000000 < in_RDI->m_state->indref) {
    memcpy(local_68,"check failed: (ind >= m_state->indref)",0x27);
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location((Location *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28
                       ,(size_t)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff18 = (flag_t)local_90;
    in_stack_ffffffffffffff1c = (flag_t)((ulong)local_90 >> 0x20);
    LVar2.super_LineCol.line = (size_t)pPStack_88;
    LVar2.super_LineCol.offset = local_90;
    LVar2.super_LineCol.col = local_80;
    LVar2.name.str = (char *)uStack_78;
    LVar2.name.len = local_70;
    (*p_Var1)(local_68,0x27,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_ffffffffffffff20 = pPStack_88;
  }
  if (stack0xffffffffffffffc8 == in_RDI->m_state->indref) {
    addrem_flags(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
    if ((in_RDI->m_state->line_contents).full.len <= stack0xffffffffffffffc8) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      in_stack_ffffffffffffffe0 =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      handle_error(0x344e8b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
    }
    _append_val_null((Parser *)in_stack_ffffffffffffffe0,
                     (char *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    bVar5 = false;
  }
  else {
    addrem_flags(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
    sVar4 = stack0xffffffffffffffc8;
    uVar3 = stack0xffffffffffffffc8 >> 0x38;
    bVar5 = SUB81(uVar3,0);
    unique0x10000468 = sVar4;
    _push_level(this_00,bVar5);
    _start_seq(in_stack_000002d8,(bool)in_stack_000002d7);
    _save_indentation(in_stack_00000060,in_stack_00000058);
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool Parser::_rval_dash_start_or_continue_seq()
{
    size_t ind = m_state->line_contents.current_col();
    _RYML_CB_ASSERT(m_stack.m_callbacks, ind >= m_state->indref);
    size_t delta_ind = ind - m_state->indref;
    if( ! delta_ind)
    {
        _c4dbgp("prev val was empty");
        addrem_flags(RNXT, RVAL);
        _append_val_null(&m_state->line_contents.full[ind]);
        return false;
    }
    _c4dbgp("val is a nested seq, indented");
    addrem_flags(RNXT, RVAL); // before _push_level!
    _push_level();
    _start_seq();
    _save_indentation();
    return true;
}